

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.h
# Opt level: O0

void __thiscall llvm::buffer_ostream::~buffer_ostream(buffer_ostream *this)

{
  raw_ostream *this_00;
  StringRef Str;
  buffer_ostream *this_local;
  
  (this->super_raw_svector_ostream).super_raw_pwrite_stream.super_raw_ostream._vptr_raw_ostream =
       (_func_int **)&PTR__buffer_ostream_030a5060;
  this_00 = this->OS;
  Str = raw_svector_ostream::str(&this->super_raw_svector_ostream);
  raw_ostream::operator<<(this_00,Str);
  SmallVector<char,_0U>::~SmallVector(&this->Buffer);
  raw_svector_ostream::~raw_svector_ostream(&this->super_raw_svector_ostream);
  return;
}

Assistant:

~buffer_ostream() override { OS << str(); }